

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O2

void savenames(memfile *mf)

{
  ushort uVar1;
  char *__s;
  objclass *poVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  
  mtag(mf,0,MTAG_OCLASSES);
  mfmagic_set(mf,0x4c4c434f);
  for (lVar6 = 0; lVar6 != 0x12; lVar6 = lVar6 + 1) {
    mwrite32(mf,bases[lVar6]);
  }
  for (lVar6 = 0; lVar6 != 0x21a; lVar6 = lVar6 + 1) {
    mwrite32(mf,(int)disco[lVar6]);
  }
  for (lVar6 = 0x22; poVar2 = objects, lVar6 != 0x5432; lVar6 = lVar6 + 0x28) {
    uVar3 = (uint)*(byte *)((long)objects + lVar6 + -0x12);
    uVar3 = (uVar3 << 0x18) >> 4 & 0xf000000 | uVar3 << 0x1c;
    uVar3 = (uVar3 >> 2 & 0x33000000) + (uVar3 & 0x33000000) * 4;
    uVar1 = *(ushort *)((long)objects + lVar6 + -0x11);
    uVar5 = (uint)uVar1;
    mwrite32(mf,(uVar5 & 0x1f0) << 0xb |
                (uVar5 & 0xc) << 0x12 |
                (uVar1 & 2) << 0x15 |
                (uVar5 & 1) << 0x17 | (uVar3 >> 1 & 0x55000000) + (uVar3 & 0x55000000) * 2);
    mwrite16(mf,*(int16_t *)((long)poVar2 + lVar6 + -0x22));
    mwrite16(mf,*(int16_t *)((long)poVar2 + lVar6 + -0x20));
    mwrite16(mf,*(int16_t *)((long)poVar2 + lVar6 + -8));
    mwrite16(mf,*(int16_t *)((long)poVar2 + lVar6 + -10));
    mwrite16(mf,*(int16_t *)((long)poVar2 + lVar6 + -6));
    mwrite16(mf,*(int16_t *)((long)&poVar2->oc_name_idx + lVar6));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -0xf));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -0xe));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -0xd));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -0xc));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -0xb));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -4));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -3));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -2));
    mwrite8(mf,*(int8_t *)((long)poVar2 + lVar6 + -1));
    __s = *(char **)((long)poVar2 + lVar6 + -0x1a);
    if (__s == (char *)0x0) {
      uVar3 = 0;
    }
    else {
      sVar4 = strlen(__s);
      uVar3 = (int)sVar4 + 1;
    }
    mwrite32(mf,uVar3);
    if (uVar3 != 0) {
      mwrite(mf,*(void **)((long)poVar2 + lVar6 + -0x1a),uVar3);
    }
  }
  return;
}

Assistant:

void savenames(struct memfile *mf)
{
	int i;

	mtag(mf, 0, MTAG_OCLASSES);
	mfmagic_set(mf, OCLASSES_MAGIC);
	for (i = 0; i < MAXOCLASSES; i++)
	    mwrite32(mf, bases[i]);

	for (i = 0; i < NUM_OBJECTS; i++)
	    mwrite32(mf, disco[i]);

	for (i = 0; i < NUM_OBJECTS; i++)
	    saveobjclass(mf, &objects[i]);
}